

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::csv_reporter::do_measurement_start
          (csv_reporter *this,
          execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *plan)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  char *this_01;
  string sStack_38;
  
  this_00 = &(this->super_reporter).os;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(undefined8 *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 8) = 7;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) =
       *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) & 0xfffffefb;
  if (this->verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"collecting ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->n_samples);
    poVar2 = std::operator<<(poVar2," samples, ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,plan->iterations_per_sample);
    this_01 = " iterations each, in estimated ";
    poVar2 = std::operator<<(poVar2," iterations each, in estimated ");
    detail::pretty_duration_abi_cxx11_
              (&sStack_38,(detail *)this_01,(fp_seconds)(plan->estimated_duration).__r);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void do_measurement_start(execution_plan<fp_seconds> plan) override {
            report_stream() << std::setprecision(7);
            report_stream().unsetf(std::ios::floatfield);
            if(verbose) progress_stream() << "collecting " << n_samples << " samples, " << plan.iterations_per_sample << " iterations each, in estimated " << detail::pretty_duration(plan.estimated_duration) << "\n";
        }